

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

Float AdaptiveSimpson(function<float_(float)> *f,Float x0,Float x1,Float eps,int depth)

{
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  float __args_3;
  float __args_4;
  float __args_5;
  float fVar3;
  int count;
  function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> integrate;
  
  count = 0;
  integrate = (function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>)
              ZEXT1232(ZEXT812(0));
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = f;
  puVar2[1] = &count;
  integrate.super__Function_base._M_functor._M_unused._M_object = puVar2;
  puVar2[2] = &integrate;
  integrate.super__Function_base._M_manager =
       std::
       _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
       ::_M_manager;
  integrate._M_invoker =
       std::
       _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
       ::_M_invoke;
  __args_3 = std::function<float_(float)>::operator()(f,x0);
  fVar3 = (x0 + x1) * 0.5;
  __args_4 = std::function<float_(float)>::operator()(f,fVar3);
  __args_5 = std::function<float_(float)>::operator()(f,x1);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)__args_3),ZEXT416((uint)__args_4),ZEXT416(0x40800000));
  fVar3 = std::function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>::
          operator()(&integrate,x0,fVar3,x1,__args_3,__args_4,__args_5,
                     (x1 - x0) * 0.16666667 * (auVar1._0_4_ + __args_5),eps,depth);
  std::_Function_base::~_Function_base(&integrate.super__Function_base);
  return fVar3;
}

Assistant:

Float AdaptiveSimpson(const std::function<Float(Float)>& f, Float x0, Float x1,
                      Float eps = 1e-6f, int depth = 6) {
    int count = 0;
    /* Define an recursive lambda function for integration over subintervals */
    std::function<Float(Float, Float, Float, Float, Float, Float, Float, Float, int)>
        integrate = [&](Float a, Float b, Float c, Float fa, Float fb, Float fc, Float I,
                        Float eps, int depth) {
            /* Evaluate the function at two intermediate points */
            Float d = 0.5f * (a + b), e = 0.5f * (b + c), fd = f(d), fe = f(e);

            /* Simpson integration over each subinterval */
            Float h = c - a, I0 = (Float)(1.0 / 12.0) * h * (fa + 4 * fd + fb),
                  I1 = (Float)(1.0 / 12.0) * h * (fb + 4 * fe + fc), Ip = I0 + I1;
            ++count;

            /* Stopping criterion from J.N. Lyness (1969)
              "Notes on the adaptive Simpson quadrature routine" */
            if (depth <= 0 || std::abs(Ip - I) < 15 * eps) {
                // Richardson extrapolation
                return Ip + (Float)(1.0 / 15.0) * (Ip - I);
            }

            return integrate(a, d, b, fa, fd, fb, I0, .5f * eps, depth - 1) +
                   integrate(b, e, c, fb, fe, fc, I1, .5f * eps, depth - 1);
        };
    Float a = x0, b = 0.5f * (x0 + x1), c = x1;
    Float fa = f(a), fb = f(b), fc = f(c);
    Float I = (c - a) * (Float)(1.0 / 6.0) * (fa + 4 * fb + fc);
    return integrate(a, b, c, fa, fb, fc, I, eps, depth);
}